

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElGamalEncryption.cpp
# Opt level: O2

EllypticPoint * __thiscall
ElGamalEncryption::decode
          (EllypticPoint *__return_storage_ptr__,ElGamalEncryption *this,
          pair<EllypticPoint,_EllypticPoint> *C)

{
  EllypticPoint EStack_118;
  EllypticPoint local_98;
  
  EllypticPoint::operator*(&local_98,&C->first,&this->d);
  EllypticPoint::operator-(&EStack_118,&local_98);
  EllypticPoint::operator+(__return_storage_ptr__,&C->second,&EStack_118);
  EllypticPoint::~EllypticPoint(&EStack_118);
  EllypticPoint::~EllypticPoint(&local_98);
  return __return_storage_ptr__;
}

Assistant:

EllypticPoint ElGamalEncryption::decode(pair<EllypticPoint, EllypticPoint> C) {
    EllypticPoint P = C.second + (-(C.first * d));
    return P;
}